

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte bVar1;
  byte bVar2;
  float fVar3;
  int iVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  byte *pbVar14;
  int iVar15;
  bool bVar16;
  int iVar17;
  double dVar18;
  int local_6c;
  
  *pResult = 0.0;
  lVar13 = (long)length;
  uVar9 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar9 == 1) {
    uVar12 = 1;
    lVar10 = 1;
    pbVar7 = (byte *)z;
  }
  else {
    lVar10 = 0x300000000 - ((ulong)enc << 0x20);
    for (lVar11 = (long)(int)(3 - uVar9); (lVar11 < lVar13 && (z[lVar11] == '\0'));
        lVar11 = lVar11 + 2) {
      lVar10 = lVar10 + 0x200000000;
    }
    uVar12 = (uint)(lVar13 <= lVar11);
    lVar13 = (ulong)enc + (lVar10 >> 0x20) + -3;
    pbVar7 = (byte *)(z + (uVar9 & 1));
    lVar10 = 2;
  }
  pbVar14 = (byte *)(z + lVar13);
  local_6c = 1;
  while( true ) {
    if (pbVar14 <= pbVar7) {
      return 0;
    }
    bVar1 = *pbVar7;
    if ((""[bVar1] & 1) == 0) break;
    pbVar7 = pbVar7 + lVar10;
  }
  iVar4 = 0;
  lVar13 = 0;
  if ((bVar1 - 0x2b & 0xfd) == 0) {
    lVar13 = lVar10;
  }
  pbVar8 = pbVar7 + lVar13 + lVar10;
  for (pbVar7 = pbVar7 + lVar13; (pbVar7 < pbVar14 && (*pbVar7 == 0x30)); pbVar7 = pbVar7 + lVar10)
  {
    iVar4 = iVar4 + 1;
    pbVar8 = pbVar8 + lVar10;
  }
  for (lVar13 = 0;
      ((pbVar7 < pbVar14 && (bVar2 = *pbVar7, (ulong)bVar2 - 0x30 < 10)) &&
      (lVar13 < 0xccccccccccccccb)); lVar13 = lVar13 * 10 + (long)(char)bVar2 + -0x30) {
    pbVar7 = pbVar7 + lVar10;
    iVar4 = iVar4 + 1;
    pbVar8 = pbVar8 + lVar10;
  }
  iVar6 = 0;
  iVar15 = 0;
  while( true ) {
    if (pbVar14 <= pbVar7) goto LAB_0012e703;
    if ((ulong)*pbVar7 - 0x3a < 0xfffffffffffffff6) break;
    pbVar7 = pbVar7 + lVar10;
    iVar4 = iVar4 + 1;
    iVar15 = iVar15 + 1;
    pbVar8 = pbVar8 + lVar10;
  }
  if (*pbVar7 == 0x2e) {
    iVar17 = 0;
    for (; ((pbVar8 < pbVar14 && (bVar2 = *pbVar8, (ulong)bVar2 - 0x30 < 10)) &&
           (lVar13 < 0xccccccccccccccb)); lVar13 = lVar13 * 10 + (long)(char)bVar2 + -0x30) {
      pbVar8 = pbVar8 + lVar10;
      iVar17 = iVar17 + -1;
    }
    iVar15 = iVar15 + iVar17;
    iVar4 = iVar4 - iVar17;
    for (; (pbVar7 = pbVar8, pbVar8 < pbVar14 && (0xfffffffffffffff5 < (ulong)*pbVar8 - 0x3a));
        pbVar8 = pbVar8 + lVar10) {
      iVar4 = iVar4 + 1;
    }
  }
  if (pbVar7 < pbVar14) {
    if ((*pbVar7 | 0x20) == 0x65) {
      pbVar7 = pbVar7 + lVar10;
      if (pbVar14 <= pbVar7) {
        iVar6 = 0;
        local_6c = 1;
        bVar16 = false;
        goto LAB_0012e706;
      }
      if (*pbVar7 == 0x2b) {
        pbVar7 = pbVar7 + lVar10;
LAB_0012e934:
        local_6c = 1;
      }
      else {
        if (*pbVar7 != 0x2d) goto LAB_0012e934;
        pbVar7 = pbVar7 + lVar10;
        local_6c = -1;
      }
      iVar6 = 0;
      bVar16 = false;
      for (; (pbVar7 < pbVar14 && (0xfffffffffffffff5 < (ulong)*pbVar7 - 0x3a));
          pbVar7 = pbVar7 + lVar10) {
        bVar16 = 9999 < iVar6;
        iVar6 = iVar6 * 10 + -0x30 + (int)(char)*pbVar7;
        if (bVar16) {
          iVar6 = 10000;
        }
        bVar16 = true;
      }
    }
    else {
      iVar6 = 0;
      bVar16 = true;
      local_6c = 1;
    }
    if (bVar16 && iVar4 != 0) {
      bVar16 = true;
      while ((pbVar7 < pbVar14 && ((""[*pbVar7] & 1) != 0))) {
        pbVar7 = pbVar7 + lVar10;
      }
    }
LAB_0012e706:
    if (lVar13 == 0) {
      if (iVar4 == 0) {
        dVar18 = 0.0;
      }
      else {
        dVar18 = -0.0;
      }
      if (bVar1 != 0x2d) {
        dVar18 = 0.0;
      }
    }
    else {
      uVar5 = iVar6 * local_6c + iVar15;
      uVar9 = uVar5;
      if ((int)uVar5 < 0) {
        for (; (lVar13 % 10 == 0 && (uVar9 != 0)); uVar9 = uVar9 + 1) {
          lVar13 = lVar13 / 10;
        }
        uVar9 = -uVar9;
      }
      else {
        while( true ) {
          if ((0xccccccccccccccb < lVar13) || (uVar9 == 0)) break;
          lVar13 = lVar13 * 10;
          uVar9 = uVar9 - 1;
        }
      }
      lVar10 = -lVar13;
      if (bVar1 != 0x2d) {
        lVar10 = lVar13;
      }
      if (uVar9 == 0) {
        dVar18 = (double)lVar10;
      }
      else if (uVar9 - 0x134 < 0x22) {
        fVar3 = 1.0;
        for (; (int)uVar9 % 0x134 != 0; uVar9 = uVar9 - 1) {
          fVar3 = fVar3 * 10.0;
        }
        if ((int)uVar5 < 0) {
          dVar18 = (double)((float)lVar10 / fVar3) / 1e+308;
        }
        else {
          dVar18 = (double)((float)lVar10 * fVar3) * 1e+308;
        }
      }
      else if (uVar9 < 0x156) {
        fVar3 = 1.0;
        for (; (int)uVar9 % 0x16 != 0; uVar9 = uVar9 - 1) {
          fVar3 = fVar3 * 10.0;
        }
        for (; 0 < (int)uVar9; uVar9 = uVar9 - 0x16) {
          fVar3 = fVar3 * 1e+22;
        }
        if ((int)uVar5 < 0) {
          dVar18 = (double)((float)lVar10 / fVar3);
        }
        else {
          dVar18 = (double)((float)lVar10 * fVar3);
        }
      }
      else if ((int)uVar5 < 0) {
        dVar18 = (double)((ulong)(double)lVar10 & 0x8000000000000000);
      }
      else {
        dVar18 = (double)lVar10 * INFINITY;
      }
    }
    if (iVar4 < 1) {
      uVar12 = 0;
    }
    if (pbVar7 < pbVar14) {
      uVar12 = 0;
    }
    *pResult = dVar18;
    if (bVar16) {
      return uVar12;
    }
    return 0;
  }
LAB_0012e703:
  bVar16 = true;
  goto LAB_0012e706;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = z+i+enc-3;
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* skip leading zeroes */
  while( z<zEnd && z[0]=='0' ) z+=incr, nDigits++;

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr, nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++, d++;
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
      s = s*10 + (*z - '0');
      z+=incr, nDigits++, d--;
    }
    /* skip non-significant digits */
    while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++;
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    if( z>=zEnd ) goto do_atof_calc;
    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  if( nDigits && eValid ){
    while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  }

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  /* if 0 significand */
  if( !s ) {
    /* In the IEEE 754 standard, zero is signed.
    ** Add the sign if we've seen at least one digit */
    result = (sign<0 && nDigits) ? -(double)0 : (double)0;
  } else {
    /* attempt to reduce exponent */
    if( esign>0 ){
      while( s<(LARGEST_INT64/10) && e>0 ) e--,s*=10;
    }else{
      while( !(s%10) && e>0 ) e--,s/=10;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    /* if exponent, scale significand as appropriate
    ** and store in result. */
    if( e ){
      LONGDOUBLE_TYPE scale = 1.0;
      /* attempt to handle extremely small/large numbers better */
      if( e>307 && e<342 ){
        while( e%308 ) { scale *= 1.0e+1; e -= 1; }
        if( esign<0 ){
          result = s / scale;
          result /= 1.0e+308;
        }else{
          result = s * scale;
          result *= 1.0e+308;
        }
      }else if( e>=342 ){
        if( esign<0 ){
          result = 0.0*s;
        }else{
          result = 1e308*1e308*s;  /* Infinity */
        }
      }else{
        /* 1.0e+22 is the largest power of 10 than can be 
        ** represented exactly. */
        while( e%22 ) { scale *= 1.0e+1; e -= 1; }
        while( e>0 ) { scale *= 1.0e+22; e -= 22; }
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    } else {
      result = (double)s;
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z>=zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}